

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

uint * __thiscall Array<unsigned_int>::append(Array<unsigned_int> *this,uint *value)

{
  uint *puVar1;
  uint *item;
  usize size;
  uint *value_local;
  Array<unsigned_int> *this_local;
  
  reserve(this,((long)(this->_end).item - (long)(this->_begin).item >> 2) + 1);
  puVar1 = (this->_end).item;
  *puVar1 = *value;
  (this->_end).item = (this->_end).item + 1;
  return puVar1;
}

Assistant:

T& append(const T& value)
  {
    usize size = _end.item - _begin.item;
    reserve(size + 1);
    T* item = _end.item;
#ifdef VERIFY
    VERIFY(new(item) T(value) == item);
#else
    new(item) T(value);
#endif
    ++_end.item;
    return *item;
  }